

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O2

void __thiscall
Js::JSONStringifier::SetNumericProperty
          (JSONStringifier *this,double value,Var valueVar,JSONProperty *prop)

{
  bool bVar1;
  charcount_t rhs;
  uint32 uVar2;
  JavascriptString *ptr;
  
  bVar1 = NumberUtilities::IsFinite(value);
  if (bVar1) {
    prop->type = Number;
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(&(prop->field_1).numericValue.value,valueVar);
    ptr = JavascriptConversion::ToString(valueVar,this->scriptContext);
    Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierSet
              (&(prop->field_1).numericValue.string,ptr);
    uVar2 = this->totalStringLength;
    rhs = JavascriptString::GetLength((prop->field_1).numericValue.string.ptr);
    uVar2 = UInt32Math::Add(uVar2,rhs);
    this->totalStringLength = uVar2;
    return;
  }
  SetNullProperty(this,prop);
  return;
}

Assistant:

void
JSONStringifier::SetNumericProperty(double value, _In_ Var valueVar, _Out_ JSONProperty* prop)
{
    if (NumberUtilities::IsFinite(value))
    {
        prop->type = JSONContentType::Number;
        prop->numericValue.value = valueVar;
        prop->numericValue.string = JavascriptConversion::ToString(valueVar, this->scriptContext);
        this->totalStringLength = UInt32Math::Add(this->totalStringLength, prop->numericValue.string->GetLength());
    }
    else
    {
        this->SetNullProperty(prop);
    }
}